

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cpp
# Opt level: O2

int tracy::dwarf_lookup_pc
              (backtrace_state *state,dwarf_data *ddata,uintptr_t pc,
              backtrace_full_callback callback,backtrace_error_callback error_callback,void *data,
              int *found)

{
  unit_addrs *puVar1;
  function_addrs *pfVar2;
  long *plVar3;
  unit *u;
  ulong uVar4;
  function *function;
  char *__s;
  uint64_t *puVar5;
  backtrace_full_callback p_Var6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uchar uVar10;
  byte bVar11;
  uint16_t uVar12;
  int iVar13;
  uint uVar14;
  void *pvVar15;
  size_t sVar16;
  uint64_t uVar17;
  void *pvVar18;
  size_t sVar19;
  size_t sVar20;
  char *pcVar21;
  unit *puVar22;
  undefined8 *puVar23;
  size_t sVar24;
  backtrace_state *pbVar25;
  syminfo p_Var26;
  backtrace_state *pbVar27;
  int64_t iVar28;
  dwarf_data *pdVar29;
  char **ppcVar30;
  function_vector *pfVar31;
  undefined4 *puVar32;
  dwarf_data *pc_00;
  code *data_00;
  backtrace_error_callback error_callback_00;
  ulong uVar33;
  backtrace_error_callback extraout_RDX;
  backtrace_error_callback extraout_RDX_00;
  backtrace_error_callback extraout_RDX_01;
  backtrace_error_callback extraout_RDX_02;
  backtrace_error_callback extraout_RDX_03;
  backtrace_error_callback error_callback_01;
  uint uVar34;
  uint uVar35;
  line_header *hdr;
  dwarf_buf *buf;
  dwarf_data *pdVar36;
  dwarf_data *pdVar37;
  dwarf_data *filename_00;
  uchar *puVar38;
  function_addrs *pfVar39;
  function_addrs *pfVar40;
  dwarf_data *pdVar41;
  long lVar42;
  unit_addrs *puVar43;
  unit_addrs *puVar44;
  unit **ppuVar45;
  bool bVar46;
  dwarf_buf *local_1a0;
  dwarf_data *local_198;
  size_t *local_188;
  uintptr_t pc_local;
  backtrace_full_callback local_168;
  dwarf_data *local_160;
  char *filename;
  uint uStack_150;
  uint uStack_14c;
  undefined1 local_148 [16];
  undefined1 local_138 [8];
  syminfo p_Stack_130;
  undefined1 local_128 [16];
  backtrace_freelist_struct *local_118 [2];
  dwarf_data *local_108;
  size_t *local_100;
  int lineno;
  undefined4 uStack_f4;
  dwarf_data *pdStack_f0;
  dwarf_data *local_e8;
  dwarf_data *pdStack_e0;
  size_t local_d8;
  unit **ppuStack_d0;
  void *local_c8;
  uchar *puStack_c0;
  dwarf_buf line_buf;
  undefined1 local_78 [24];
  uchar *puStack_60;
  dwarf_data *local_50;
  char **local_48;
  uchar *local_40;
  int local_34;
  
  *found = 1;
  if ((pc != 0xffffffffffffffff && ddata->addrs_count != 0) &&
     (pc_local = pc,
     pvVar15 = bsearch(&pc_local,ddata->addrs,ddata->addrs_count,0x18,unit_addrs_search),
     pvVar15 != (void *)0x0)) {
    puVar43 = (unit_addrs *)((long)pvVar15 + -0x18);
    do {
      puVar44 = puVar43 + 1;
      puVar1 = puVar43 + 2;
      puVar43 = puVar44;
    } while (pc_local == puVar1->low);
    do {
      if (pc_local < puVar44->high) {
        ppuVar45 = &puVar44->u;
        goto LAB_00398074;
      }
    } while ((puVar44 != ddata->addrs) &&
            (puVar43 = puVar44 + -1, puVar5 = &puVar44->low, puVar44 = puVar44 + -1,
            *puVar5 <= puVar43->low));
  }
  *found = 0;
  return 0;
LAB_00398074:
  puVar22 = *ppuVar45;
  pbVar25 = (backtrace_state *)puVar22->lines;
  if ((((unit_addrs *)(ppuVar45 + -2) <= ddata->addrs) || (pc_local < ppuVar45[-5])) ||
     (ppuVar45[-4] <= pc_local)) goto LAB_003980cc;
  if (state->threaded != 0) {
    pbVar25 = (backtrace_state *)puVar22->lines;
  }
  if (pbVar25 != (backtrace_state *)0xffffffffffffffff) goto LAB_003980cc;
  ppuVar45 = ppuVar45 + -3;
  goto LAB_00398074;
switchD_00398a72_caseD_0:
  local_160 = (dwarf_data *)read_uleb128((dwarf_buf *)pdVar36);
  pdVar37 = pdVar36;
  bVar11 = read_byte((dwarf_buf *)pdVar36);
  pdVar41 = (dwarf_data *)0x0;
  uVar4 = 0;
  pdVar29 = local_108;
  uVar14 = (uint)bVar11;
  switch(bVar11) {
  case 1:
    goto switchD_00398a72_caseD_6;
  case 2:
    pdVar41 = (dwarf_data *)read_address((dwarf_buf *)pdVar36,filename._4_4_);
    uVar4 = uVar33;
    pdVar37 = pdVar36;
    pdVar29 = filename_00;
    uVar14 = uVar34;
    goto switchD_00398a72_caseD_6;
  case 3:
    pdVar37 = pdVar36;
    pdVar29 = (dwarf_data *)read_string((dwarf_buf *)pdVar36);
    if (pdVar29 == (dwarf_data *)0x0) goto LAB_00398e72;
    local_160 = (dwarf_data *)read_uleb128((dwarf_buf *)pdVar36);
    read_uleb128((dwarf_buf *)pdVar36);
    read_uleb128((dwarf_buf *)pdVar36);
    pdVar41 = pc_00;
    uVar4 = uVar33;
    pdVar37 = pdVar36;
    uVar14 = uVar34;
    if (*(uchar *)&pdVar29->next != '/') {
      if (p_Stack_130 <= (syminfo)((ulong)local_160 & 0xffffffff)) {
        local_100 = (size_t *)0x5f328c;
        goto LAB_00398e5b;
      }
      local_40 = *(uchar **)(local_128._0_8_ + (syminfo)((ulong)local_160 & 0xffffffff) * 8);
      ppcVar30 = (char **)strlen((char *)local_40);
      pdVar37 = pdVar29;
      local_160 = (dwarf_data *)strlen((char *)pdVar29);
      local_48 = ppcVar30;
      pdVar41 = (dwarf_data *)
                backtrace_alloc((backtrace_state *)pdVar37,(long)ppcVar30 + (long)local_160 + 2,
                                line_buf.error_callback,line_buf.data);
      ppcVar30 = local_48;
      if (pdVar41 == (dwarf_data *)0x0) goto LAB_00398e72;
      local_50 = pdVar41;
      memcpy(pdVar41,local_40,(size_t)local_48);
      pdVar36 = local_50;
      *(uchar *)((long)&local_50->next + (long)ppcVar30) = '/';
      pdVar37 = (dwarf_data *)((long)ppcVar30 + (long)((long)&local_50->next + 1));
      memcpy(pdVar37,pdVar29,(size_t)((long)&local_160->next + 1));
      pdVar41 = pc_00;
      pdVar29 = pdVar36;
    }
    goto switchD_00398a72_caseD_6;
  case 4:
    goto switchD_00398a72_caseD_5;
  }
  iVar13 = advance((dwarf_buf *)pdVar36,(size_t)((long)&local_160[-1].fvec.count + 7));
  pdVar41 = pc_00;
  uVar4 = uVar33;
  pdVar37 = pdVar36;
  pdVar29 = filename_00;
  uVar14 = uVar34;
  if (iVar13 == 0) goto LAB_00398e72;
  goto switchD_00398a72_caseD_6;
LAB_00398e72:
  if ((((sVar16 == 0) && (line_buf.reported_underflow == 0)) && (puStack_60 != (uchar *)0x0)) &&
     (puVar23 = (undefined8 *)
                backtrace_vector_grow
                          ((backtrace_state *)pdVar37,0x18,error_callback,data,
                           (backtrace_vector *)local_78), puVar23 != (undefined8 *)0x0)) {
    *puVar23 = 0xffffffffffffffff;
    *(undefined1 (*) [16])(puVar23 + 1) = (undefined1  [16])0x0;
    iVar13 = backtrace_vector_release
                       ((backtrace_state *)pdVar37,(backtrace_vector *)local_78,error_callback,data)
    ;
    if (iVar13 == 0) goto LAB_00398245;
    pbVar25 = (backtrace_state *)local_78._0_8_;
    puVar38 = puStack_60;
    pbVar27 = (backtrace_state *)local_78._0_8_;
    backtrace_qsort((void *)local_78._0_8_,(size_t)puStack_60,0x18,line_compare);
    iVar13 = state->threaded;
    local_160 = (dwarf_data *)&ddata->fvec;
    pfVar31 = (function_vector *)0x0;
    if (iVar13 == 0) {
      pfVar31 = (function_vector *)local_160;
    }
    local_100 = &pfVar31->count;
    pdVar37 = (dwarf_data *)*ppuVar45;
    local_108 = (dwarf_data *)CONCAT44(local_108._4_4_,iVar13);
    local_1a0 = (dwarf_buf *)local_160;
    local_188 = local_100;
    if (iVar13 != 0) {
      local_188 = &line_buf.left;
      line_buf.buf = (uchar *)0x0;
      line_buf.left = 0;
      line_buf.name = (char *)0x0;
      line_buf.start = (uchar *)0x0;
      local_1a0 = &line_buf;
    }
    error_callback_01 = (backtrace_error_callback)&lineno;
    _lineno = ".debug_info";
    pdStack_f0 = (dwarf_data *)(ddata->dwarf_sections).data[0];
    local_e8 = pdVar37->next;
    pdStack_e0 = pdVar37->altlink;
    local_d8 = CONCAT44(local_d8._4_4_,ddata->is_bigendian);
    puStack_c0 = (uchar *)((ulong)puStack_c0 & 0xffffffff00000000);
    local_198 = (dwarf_data *)0x0;
    data_00 = (code *)pdVar37;
    pdVar41 = pdVar37;
    ppuStack_d0 = (unit **)error_callback;
    local_c8 = data;
    do {
      if (pdStack_e0 == (dwarf_data *)0x0) {
        if (*local_188 != 0) {
          pdVar41 = (dwarf_data *)0x18;
          data_00 = (code *)data;
          puVar32 = (undefined4 *)
                    backtrace_vector_grow
                              (pbVar27,0x18,error_callback,data,(backtrace_vector *)local_1a0);
          error_callback_01 = extraout_RDX_00;
          if (puVar32 != (undefined4 *)0x0) {
            *(undefined8 *)(puVar32 + 4) = 0;
            *puVar32 = 0xffffffff;
            puVar32[1] = 0xffffffff;
            puVar32[2] = 0xffffffff;
            puVar32[3] = 0xffffffff;
            local_198 = (dwarf_data *)*local_188;
            if ((int)local_108 == 0) {
              data_00 = (code *)data;
              pdVar41 = local_160;
              local_1a0 = (dwarf_buf *)
                          backtrace_vector_finish
                                    (state,(backtrace_vector *)local_160,error_callback,data);
              error_callback_01 = extraout_RDX_02;
              if (local_1a0 != (dwarf_buf *)0x0) {
                *local_100 = 0;
                goto LAB_003990c6;
              }
            }
            else {
              pdVar41 = (dwarf_data *)&line_buf;
              data_00 = (code *)data;
              iVar13 = backtrace_vector_release
                                 (pbVar27,(backtrace_vector *)pdVar41,error_callback,data);
              error_callback_01 = extraout_RDX_01;
              if (iVar13 != 0) {
                local_1a0 = (dwarf_buf *)local_1a0->name;
LAB_003990c6:
                data_00 = function_addrs_compare;
                pdVar41 = local_198;
                backtrace_qsort(local_1a0,(size_t)local_198,0x18,function_addrs_compare);
                error_callback_01 = extraout_RDX_03;
                goto LAB_003990f3;
              }
            }
          }
        }
        local_1a0 = (dwarf_buf *)0x0;
        local_198 = (dwarf_data *)0x0;
        goto LAB_003990f3;
      }
      data_00 = (code *)0x0;
      pdVar41 = ddata;
      pbVar27 = state;
      iVar13 = read_function_entry(state,ddata,(unit *)pdVar37,0,(dwarf_buf *)&lineno,
                                   (line_header *)&filename,error_callback,data,
                                   (function_vector *)local_1a0,(function_vector *)local_1a0);
      error_callback_01 = extraout_RDX;
    } while (iVar13 != 0);
    local_1a0 = (dwarf_buf *)0x0;
LAB_003990f3:
    free_line_header((backtrace_state *)&filename,(line_header *)pdVar41,error_callback_01,data_00);
    bVar46 = false;
  }
  else {
LAB_00398245:
    hdr = (line_header *)local_78;
    pvVar15 = data;
    backtrace_vector_free(state,(backtrace_vector *)hdr,error_callback,data);
    free_line_header((backtrace_state *)&filename,hdr,error_callback_00,pvVar15);
    pbVar25 = (backtrace_state *)0xffffffffffffffff;
    bVar46 = true;
    puVar38 = (uchar *)0x0;
    local_1a0 = (dwarf_buf *)0x0;
    local_198 = (dwarf_data *)0x0;
  }
  puVar22->lines_count = (size_t)puVar38;
  puVar22->function_addrs = (function_addrs *)local_1a0;
  puVar22->function_addrs_count = (size_t)local_198;
  puVar22->lines = (line *)pbVar25;
  if (pbVar25 == (backtrace_state *)0xffffffffffffffff) {
    if (!bVar46) {
      iVar13 = dwarf_lookup_pc(state,ddata,pc_local,local_168,error_callback,data,found);
      return iVar13;
    }
LAB_003980f2:
    iVar13 = (*local_168)(data,pc_local,0,(char *)0x0,0,(char *)0x0);
    return iVar13;
  }
  goto LAB_003982ad;
code_r0x00398773:
  pcVar21 = read_string((dwarf_buf *)&lineno);
  *(char **)(local_128._0_8_ + lVar42) = pcVar21;
  plVar3 = (long *)(local_128._0_8_ + lVar42);
  lVar42 = lVar42 + 8;
  if (*plVar3 == 0) goto LAB_00398245;
  goto LAB_00398758;
LAB_003980cc:
  if (state->threaded != 0) {
    pbVar25 = (backtrace_state *)puVar22->lines;
  }
  local_168 = callback;
  if (pbVar25 == (backtrace_state *)0x0) {
    u = *ppuVar45;
    local_78._0_16_ = (undefined1  [16])0x0;
    stack0xffffffffffffff98 = (undefined1  [16])0x0;
    _filename = (undefined1  [16])0x0;
    local_148 = (undefined1  [16])0x0;
    _local_138 = (undefined1  [16])0x0;
    local_118[0] = (backtrace_freelist_struct *)0x0;
    local_128 = (undefined1  [16])0x0;
    uVar4 = u->lineoff;
    uVar33 = (ddata->dwarf_sections).size[1];
    sVar16 = uVar33 - uVar4;
    if (uVar33 < uVar4 || sVar16 == 0) {
      (*error_callback)(data,"unit line offset out of range",0);
      goto LAB_00398245;
    }
    line_buf.start = (ddata->dwarf_sections).data[1];
    line_buf.name = ".debug_line";
    line_buf.left = sVar16;
    line_buf.buf = line_buf.start + uVar4;
    line_buf.is_bigendian = ddata->is_bigendian;
    line_buf.reported_underflow = 0;
    line_buf.error_callback = error_callback;
    line_buf.data = data;
    uVar17 = read_initial_length(&line_buf,&local_34);
    line_buf.left = uVar17;
    uVar12 = read_uint16(&line_buf);
    auVar8 = _filename;
    filename._0_4_ = CONCAT22(0,uVar12);
    if ((ushort)(uVar12 - 6) < 0xfffc) {
      pcVar21 = "unsupported line number version";
LAB_0039822b:
      buf = &line_buf;
      iVar13 = -1;
LAB_00398236:
      dwarf_buf_error(buf,pcVar21,iVar13);
    }
    else {
      if (uVar12 == 5) {
        uVar10 = read_byte(&line_buf);
        filename = (char *)CONCAT35(0,CONCAT14(uVar10,(int)filename));
        uVar10 = read_byte(&line_buf);
        if (uVar10 != '\0') {
          pcVar21 = "non-zero segment_selector_size not supported";
          goto LAB_0039822b;
        }
      }
      else {
        _uStack_150 = auVar8._8_8_;
        filename = (char *)CONCAT44(u->addrsize,CONCAT22(0,uVar12));
      }
      pdStack_e0 = (dwarf_data *)read_offset(&line_buf,local_34);
      local_d8 = CONCAT44(line_buf._36_4_,line_buf.is_bigendian);
      puStack_c0 = (uchar *)CONCAT44(line_buf._60_4_,line_buf.reported_underflow);
      local_e8 = (dwarf_data *)line_buf.buf;
      _lineno = line_buf.name;
      pdStack_f0 = (dwarf_data *)line_buf.start;
      ppuStack_d0 = (unit **)line_buf.error_callback;
      local_c8 = line_buf.data;
      iVar13 = advance(&line_buf,(size_t)pdStack_e0);
      if (iVar13 != 0) {
        uVar10 = read_byte((dwarf_buf *)&lineno);
        auVar8 = _filename;
        uStack_150._0_1_ = uVar10;
        uStack_150._1_3_ = 0;
        auVar7 = _filename;
        auVar9 = _filename;
        filename._0_4_ = auVar8._0_4_;
        if ((int)filename < 4) {
          uStack_14c = 1;
          _filename = auVar7;
        }
        else {
          _filename = auVar9;
          bVar11 = read_byte((dwarf_buf *)&lineno);
          uStack_14c = (uint)bVar11;
        }
        read_byte((dwarf_buf *)&lineno);
        pdVar37 = local_e8;
        iVar13 = advance((dwarf_buf *)&lineno,1);
        if (iVar13 == 0) {
          iVar13 = 0;
        }
        else {
          iVar13 = (int)(char)*(uchar *)&pdVar37->next;
        }
        local_148._0_4_ = iVar13;
        pdVar37 = (dwarf_data *)&lineno;
        uVar10 = read_byte((dwarf_buf *)pdVar37);
        local_148[4] = uVar10;
        local_148._5_3_ = 0;
        bVar11 = read_byte((dwarf_buf *)pdVar37);
        local_148[8] = bVar11;
        local_148._9_3_ = 0;
        local_138 = (undefined1  [8])local_e8;
        iVar13 = advance((dwarf_buf *)pdVar37,(ulong)(bVar11 - 1));
        if (iVar13 != 0) {
          if ((int)filename < 5) {
            local_1a0 = (dwarf_buf *)0x1;
            p_Stack_130 = (syminfo)0x0;
            pdVar29 = (dwarf_data *)
                      ((long)(pdStack_e0->dwarf_sections).data +
                      (long)(&local_e8->dwarf_sections + -1) + 0x20);
            sVar16 = 8;
            for (pdVar41 = local_e8; (pdVar41 < pdVar29 && (*(uchar *)&pdVar41->next != '\0'));
                pdVar41 = (dwarf_data *)((long)&pdVar41->next + sVar19 + 1)) {
              pdVar37 = pdVar41;
              sVar19 = strnlen((char *)pdVar41,(long)pdVar29 - (long)pdVar41);
              p_Stack_130 = (syminfo)local_1a0;
              sVar16 = sVar16 + 8;
              local_1a0 = (dwarf_buf *)((long)local_1a0 + 1);
            }
            p_Stack_130 = (syminfo)local_1a0;
            puVar23 = (undefined8 *)
                      backtrace_alloc((backtrace_state *)pdVar37,sVar16,
                                      (backtrace_error_callback)ppuStack_d0,local_c8);
            local_128._0_8_ = puVar23;
            if (puVar23 != (undefined8 *)0x0) {
              *puVar23 = u->comp_dir;
              lVar42 = 8;
LAB_00398758:
              if (*(uchar *)&local_e8->next == '\0') {
                pdVar37 = (dwarf_data *)&lineno;
                iVar13 = advance((dwarf_buf *)pdVar37,1);
                if (iVar13 != 0) {
                  local_1a0 = (dwarf_buf *)0x1;
                  local_128._8_8_ = 0;
                  pdVar29 = (dwarf_data *)
                            ((long)(pdStack_e0->dwarf_sections).data +
                            (long)(&local_e8->dwarf_sections + -1) + 0x20);
                  sVar16 = 8;
                  local_108 = local_e8;
                  for (pdVar41 = local_e8; (pdVar41 < pdVar29 && (*(uchar *)&pdVar41->next != '\0'))
                      ; pdVar41 = (dwarf_data *)((long)&pdVar41->next + sVar24)) {
                    sVar19 = strnlen((char *)pdVar41,(long)pdVar29 - (long)pdVar41);
                    sVar24 = leb128_len((uchar *)((long)&pdVar41->next + sVar19 + 1));
                    puVar38 = (uchar *)((long)&pdVar41->next + sVar24 + sVar19 + 1);
                    sVar24 = leb128_len(puVar38);
                    pdVar41 = (dwarf_data *)(puVar38 + sVar24);
                    pdVar37 = pdVar41;
                    sVar24 = leb128_len((uchar *)pdVar41);
                    local_128._8_8_ = local_1a0;
                    sVar16 = sVar16 + 8;
                    local_1a0 = (dwarf_buf *)((long)local_1a0 + 1);
                  }
                  local_128._8_8_ = local_1a0;
                  local_118[0] = (backtrace_freelist_struct *)
                                 backtrace_alloc((backtrace_state *)pdVar37,sVar16,
                                                 (backtrace_error_callback)ppuStack_d0,local_c8);
                  if (local_118[0] != (backtrace_freelist_struct *)0x0) {
                    *(char **)local_118[0] = u->filename;
                    lVar42 = 8;
                    pdVar41 = local_108;
                    while( true ) {
                      if (*(uchar *)&pdVar41->next == '\0') goto LAB_003986d6;
                      if (((int)puStack_c0 != 0) ||
                         (pbVar25 = (backtrace_state *)read_string((dwarf_buf *)&lineno),
                         pbVar25 == (backtrace_state *)0x0)) goto LAB_00398245;
                      p_Var26 = (syminfo)read_uleb128((dwarf_buf *)&lineno);
                      pbVar27 = pbVar25;
                      if (*(char *)&pbVar25->filename != '/') break;
LAB_0039899e:
                      *(backtrace_state **)(local_118[0] + lVar42) = pbVar27;
                      pdVar37 = (dwarf_data *)&lineno;
                      read_uleb128((dwarf_buf *)pdVar37);
                      read_uleb128((dwarf_buf *)pdVar37);
                      lVar42 = lVar42 + 8;
                      pdVar41 = local_e8;
                    }
                    if (p_Var26 < p_Stack_130) {
                      pcVar21 = *(char **)(local_128._0_8_ + p_Var26 * 8);
                      if (pcVar21 != (char *)0x0) {
                        sVar19 = strlen(pcVar21);
                        sVar20 = strlen((char *)pbVar25);
                        pbVar27 = (backtrace_state *)
                                  backtrace_alloc(pbVar27,sVar19 + sVar20 + 2,
                                                  (backtrace_error_callback)ppuStack_d0,local_c8);
                        if (pbVar27 == (backtrace_state *)0x0) goto LAB_00398245;
                        memcpy(pbVar27,pcVar21,sVar19);
                        *(char *)((long)&pbVar27->filename + sVar19) = '/';
                        memcpy((char *)((long)&pbVar27->filename + sVar19 + 1),pbVar25,sVar20 + 1);
                      }
                      goto LAB_0039899e;
                    }
                    pcVar21 = "invalid directory index in line number program header";
                    buf = (dwarf_buf *)&lineno;
                    iVar13 = 0;
                    goto LAB_00398236;
                  }
                }
              }
              else if ((int)puStack_c0 == 0) goto code_r0x00398773;
            }
          }
          else {
            iVar13 = read_line_header_format_entries
                               (state,ddata,u,(dwarf_buf *)&lineno,(line_header *)&filename,
                                (size_t *)(local_138 + 8),(char ***)local_128);
            if ((iVar13 != 0) &&
               (pdVar37 = (dwarf_data *)state,
               iVar13 = read_line_header_format_entries
                                  (state,ddata,u,(dwarf_buf *)&lineno,(line_header *)&filename,
                                   (size_t *)(local_128 + 8),(char ***)local_118), iVar13 != 0)) {
LAB_003986d6:
              if ((int)puStack_c0 == 0) {
                if ((ulong)local_128._8_8_ < 2) {
                  local_108 = (dwarf_data *)0x61276e;
                }
                else {
                  local_108 = *(dwarf_data **)(local_118[0] + 8);
                }
                local_100 = (size_t *)0x5f32bb;
                pdVar41 = (dwarf_data *)0x0;
                uVar4 = 0;
                pdVar29 = local_108;
                uVar14 = 1;
switchD_00398a72_caseD_6:
                while( true ) {
                  uVar34 = uVar14;
                  filename_00 = pdVar29;
                  uVar33 = uVar4;
                  pc_00 = pdVar41;
                  pdVar36 = (dwarf_data *)&line_buf;
                  sVar16 = line_buf.left;
                  if (line_buf.left == 0) goto LAB_00398e72;
                  pdVar37 = pdVar36;
                  bVar11 = read_byte((dwarf_buf *)pdVar36);
                  uVar14 = (uint)bVar11 - local_148._8_4_;
                  pdVar29 = filename_00;
                  if ((uint)bVar11 < (uint)local_148._8_4_) break;
                  uVar35 = uVar14 / (uint)local_148._4_4_ + (int)uVar33;
                  uVar4 = (ulong)uStack_14c;
                  pdVar41 = (dwarf_data *)
                            ((long)&pc_00->next + (ulong)(uStack_150 * uVar35) / (ulong)uStack_14c);
                  uVar14 = uVar34 + local_148._0_4_ + uVar14 % (uint)local_148._4_4_;
                  pdVar37 = (dwarf_data *)state;
                  add_line(state,ddata,(uintptr_t)pdVar41,(char *)filename_00,uVar14,
                           line_buf.error_callback,line_buf.data,(line_vector *)local_78);
                  uVar4 = (ulong)uVar35 % uVar4;
                }
                pdVar41 = pc_00;
                uVar4 = uVar33;
                uVar14 = uVar34;
                switch((ulong)bVar11) {
                case 0:
                  goto switchD_00398a72_caseD_0;
                case 1:
                  pdVar37 = (dwarf_data *)state;
                  add_line(state,ddata,(uintptr_t)pc_00,(char *)filename_00,uVar34,
                           line_buf.error_callback,line_buf.data,(line_vector *)local_78);
                  goto switchD_00398a72_caseD_6;
                case 2:
                  uVar17 = read_uleb128((dwarf_buf *)pdVar36);
                  pdVar37 = (dwarf_data *)(ulong)uStack_14c;
                  pdVar41 = (dwarf_data *)
                            ((long)&pc_00->next +
                            ((ulong)uStack_150 * (uVar17 + uVar33)) / (ulong)pdVar37);
                  uVar4 = (uVar17 + uVar33) % (ulong)pdVar37;
                  goto switchD_00398a72_caseD_6;
                case 3:
                  iVar28 = read_sleb128((dwarf_buf *)pdVar36);
                  pdVar37 = pdVar36;
                  uVar14 = uVar34 + (int)iVar28;
                  goto switchD_00398a72_caseD_6;
                case 4:
                  uVar17 = read_uleb128((dwarf_buf *)pdVar36);
                  if ((ulong)local_128._8_8_ <= uVar17) {
LAB_00398e5b:
                    pdVar37 = (dwarf_data *)&line_buf;
                    dwarf_buf_error((dwarf_buf *)pdVar37,(char *)local_100,0);
                    goto LAB_00398e72;
                  }
                  pdVar37 = pdVar36;
                  pdVar29 = *(dwarf_data **)(local_118[0] + uVar17 * 8);
                  goto switchD_00398a72_caseD_6;
                case 5:
                case 0xc:
switchD_00398a72_caseD_5:
                  read_uleb128((dwarf_buf *)pdVar36);
                  pdVar41 = pc_00;
                  uVar4 = uVar33;
                  pdVar37 = pdVar36;
                  pdVar29 = filename_00;
                  uVar14 = uVar34;
                case 6:
                case 7:
                case 10:
                case 0xb:
                  goto switchD_00398a72_caseD_6;
                case 8:
                  uVar34 = (0xff - local_148._8_4_) / (uint)local_148._4_4_ + (int)uVar33;
                  pdVar41 = (dwarf_data *)
                            ((long)&pc_00->next + (ulong)(uStack_150 * uVar34) / (ulong)uStack_14c);
                  uVar4 = (ulong)uVar34 % (ulong)uStack_14c;
                  pdVar37 = pdVar41;
                  goto switchD_00398a72_caseD_6;
                case 9:
                  uVar12 = read_uint16((dwarf_buf *)pdVar36);
                  pdVar41 = (dwarf_data *)((long)&pc_00->next + (ulong)uVar12);
                  uVar4 = 0;
                  pdVar37 = pdVar36;
                  goto switchD_00398a72_caseD_6;
                default:
                  uVar34 = (uint)*(byte *)((long)local_138 + ((ulong)bVar11 - 1));
                  while (bVar46 = uVar34 != 0, uVar34 = uVar34 - 1, bVar46) {
                    pdVar37 = pdVar36;
                    read_uleb128((dwarf_buf *)pdVar36);
                  }
                  goto switchD_00398a72_caseD_6;
                }
              }
            }
          }
        }
      }
    }
    goto LAB_00398245;
  }
  if (pbVar25 == (backtrace_state *)0xffffffffffffffff) goto LAB_003980f2;
LAB_003982ad:
  pvVar15 = bsearch(&pc_local,pbVar25,(*ppuVar45)->lines_count,0x18,line_search);
  puVar22 = *ppuVar45;
  if (pvVar15 == (void *)0x0) {
    pcVar21 = puVar22->abs_filename;
    if (pcVar21 == (char *)0x0) {
      __s = puVar22->filename;
      if (__s == (char *)0x0) {
        pcVar21 = (char *)0x0;
      }
      else {
        pcVar21 = __s;
        if ((*__s != '/') &&
           (pbVar25 = (backtrace_state *)puVar22->comp_dir, pbVar25 != (backtrace_state *)0x0)) {
          sVar19 = strlen(__s);
          pbVar27 = pbVar25;
          sVar20 = strlen((char *)pbVar25);
          pcVar21 = (char *)backtrace_alloc(pbVar27,sVar19 + sVar20 + 2,error_callback,data);
          if (pcVar21 == (char *)0x0) {
            *found = 0;
            return 0;
          }
          memcpy(pcVar21,pbVar25,sVar20);
          pcVar21[sVar20] = '/';
          memcpy(pcVar21 + sVar20 + 1,__s,sVar19 + 1);
          puVar22 = *ppuVar45;
        }
      }
      puVar22->abs_filename = pcVar21;
    }
    iVar13 = 0;
  }
  else {
    if (puVar22->function_addrs_count != 0) {
      pvVar18 = bsearch(&pc_local,puVar22->function_addrs,puVar22->function_addrs_count,0x18,
                        function_addrs_search);
      p_Var6 = local_168;
      if (pvVar18 == (void *)0x0) {
        pcVar21 = *(char **)((long)pvVar15 + 8);
        iVar13 = *(int *)((long)pvVar15 + 0x10);
        goto LAB_00398553;
      }
      pfVar39 = (function_addrs *)((long)pvVar18 + -0x18);
      do {
        pfVar40 = pfVar39 + 1;
        pfVar2 = pfVar39 + 2;
        pfVar39 = pfVar40;
      } while (pc_local == pfVar2->low);
      do {
        if (pc_local < pfVar40->high) {
          function = pfVar40->function;
          filename = (char *)*(undefined8 *)((long)pvVar15 + 8);
          _lineno = (char *)CONCAT44(uStack_f4,*(undefined4 *)((long)pvVar15 + 0x10));
          iVar13 = report_inlined_functions(pc_local,function,local_168,data,&filename,&lineno);
          if (iVar13 == 0) {
            iVar13 = (*p_Var6)(data,pc_local,pfVar40->low,filename,(int)_lineno,function->name);
            return iVar13;
          }
          return iVar13;
        }
      } while ((pfVar40 != (*ppuVar45)->function_addrs) &&
              (pfVar39 = pfVar40 + -1, puVar5 = &pfVar40->low, pfVar40 = pfVar40 + -1,
              *puVar5 <= pfVar39->low));
    }
    pcVar21 = *(char **)((long)pvVar15 + 8);
    iVar13 = *(int *)((long)pvVar15 + 0x10);
  }
LAB_00398553:
  iVar13 = (*local_168)(data,pc_local,0,pcVar21,iVar13,(char *)0x0);
  return iVar13;
}

Assistant:

static int
dwarf_lookup_pc (struct backtrace_state *state, struct dwarf_data *ddata,
		 uintptr_t pc, backtrace_full_callback callback,
		 backtrace_error_callback error_callback, void *data,
		 int *found)
{
  struct unit_addrs *entry;
  int found_entry;
  struct unit *u;
  int new_data;
  struct line *lines;
  struct line *ln;
  struct function_addrs *p;
  struct function_addrs *fmatch;
  struct function *function;
  const char *filename;
  int lineno;
  int ret;

  *found = 1;

  /* Find an address range that includes PC.  Our search isn't safe if
     PC == -1, as we use that as a sentinel value, so skip the search
     in that case.  */
  entry = (ddata->addrs_count == 0 || pc + 1 == 0
	   ? NULL
	   : (struct unit_addrs*)bsearch (&pc, ddata->addrs, ddata->addrs_count,
		      sizeof (struct unit_addrs), unit_addrs_search));

  if (entry == NULL)
    {
      *found = 0;
      return 0;
    }

  /* Here pc >= entry->low && pc < (entry + 1)->low.  The unit_addrs
     are sorted by low, so if pc > p->low we are at the end of a range
     of unit_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (entry + 1)->low)
    ++entry;
  found_entry = 0;
  while (1)
    {
      if (pc < entry->high)
	{
	  found_entry = 1;
	  break;
	}
      if (entry == ddata->addrs)
	break;
      if ((entry - 1)->low < entry->low)
	break;
      --entry;
    }
  if (!found_entry)
    {
      *found = 0;
      return 0;
    }

  /* We need the lines, lines_count, function_addrs,
     function_addrs_count fields of u.  If they are not set, we need
     to set them.  When running in threaded mode, we need to allow for
     the possibility that some other thread is setting them
     simultaneously.  */

  u = entry->u;
  lines = u->lines;

  /* Skip units with no useful line number information by walking
     backward.  Useless line number information is marked by setting
     lines == -1.  */
  while (entry > ddata->addrs
	 && pc >= (entry - 1)->low
	 && pc < (entry - 1)->high)
    {
      if (state->threaded)
	lines = (struct line *) backtrace_atomic_load_pointer (&u->lines);

      if (lines != (struct line *) (uintptr_t) -1)
	break;

      --entry;

      u = entry->u;
      lines = u->lines;
    }

  if (state->threaded)
    lines = backtrace_atomic_load_pointer (&u->lines);

  new_data = 0;
  if (lines == NULL)
    {
      struct function_addrs *function_addrs;
      size_t function_addrs_count;
      struct line_header lhdr;
      size_t count;

      /* We have never read the line information for this unit.  Read
	 it now.  */

      function_addrs = NULL;
      function_addrs_count = 0;
      if (read_line_info (state, ddata, error_callback, data, entry->u, &lhdr,
			  &lines, &count))
	{
	  struct function_vector *pfvec;

	  /* If not threaded, reuse DDATA->FVEC for better memory
	     consumption.  */
	  if (state->threaded)
	    pfvec = NULL;
	  else
	    pfvec = &ddata->fvec;
	  read_function_info (state, ddata, &lhdr, error_callback, data,
			      entry->u, pfvec, &function_addrs,
			      &function_addrs_count);
	  free_line_header (state, &lhdr, error_callback, data);
	  new_data = 1;
	}

      /* Atomically store the information we just read into the unit.
	 If another thread is simultaneously writing, it presumably
	 read the same information, and we don't care which one we
	 wind up with; we just leak the other one.  We do have to
	 write the lines field last, so that the acquire-loads above
	 ensure that the other fields are set.  */

      if (!state->threaded)
	{
	  u->lines_count = count;
	  u->function_addrs = function_addrs;
	  u->function_addrs_count = function_addrs_count;
	  u->lines = lines;
	}
      else
	{
	  backtrace_atomic_store_size_t (&u->lines_count, count);
	  backtrace_atomic_store_pointer (&u->function_addrs, function_addrs);
	  backtrace_atomic_store_size_t (&u->function_addrs_count,
					 function_addrs_count);
	  backtrace_atomic_store_pointer (&u->lines, lines);
	}
    }

  /* Now all fields of U have been initialized.  */

  if (lines == (struct line *) (uintptr_t) -1)
    {
      /* If reading the line number information failed in some way,
	 try again to see if there is a better compilation unit for
	 this PC.  */
      if (new_data)
	return dwarf_lookup_pc (state, ddata, pc, callback, error_callback,
				data, found);
      return callback (data, pc, 0, NULL, 0, NULL);
    }

  /* Search for PC within this unit.  */

  ln = (struct line *) bsearch (&pc, lines, entry->u->lines_count,
				sizeof (struct line), line_search);
  if (ln == NULL)
    {
      /* The PC is between the low_pc and high_pc attributes of the
	 compilation unit, but no entry in the line table covers it.
	 This implies that the start of the compilation unit has no
	 line number information.  */

      if (entry->u->abs_filename == NULL)
	{
	  const char *filename;

	  filename = entry->u->filename;
	  if (filename != NULL
	      && !IS_ABSOLUTE_PATH (filename)
	      && entry->u->comp_dir != NULL)
	    {
	      size_t filename_len;
	      const char *dir;
	      size_t dir_len;
	      char *s;

	      filename_len = strlen (filename);
	      dir = entry->u->comp_dir;
	      dir_len = strlen (dir);
	      s = (char *) backtrace_alloc (state, dir_len + filename_len + 2,
					    error_callback, data);
	      if (s == NULL)
		{
		  *found = 0;
		  return 0;
		}
	      memcpy (s, dir, dir_len);
	      /* FIXME: Should use backslash if DOS file system.  */
	      s[dir_len] = '/';
	      memcpy (s + dir_len + 1, filename, filename_len + 1);
	      filename = s;
	    }
	  entry->u->abs_filename = filename;
	}

      return callback (data, pc, 0, entry->u->abs_filename, 0, NULL);
    }

  /* Search for function name within this unit.  */

  if (entry->u->function_addrs_count == 0)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  p = ((struct function_addrs *)
       bsearch (&pc, entry->u->function_addrs,
		entry->u->function_addrs_count,
		sizeof (struct function_addrs),
		function_addrs_search));
  if (p == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  /* Here pc >= p->low && pc < (p + 1)->low.  The function_addrs are
     sorted by low, so if pc > p->low we are at the end of a range of
     function_addrs with the same low value.  If pc == p->low walk
     forward to the end of the range with that low value.  Then walk
     backward and use the first range that includes pc.  */
  while (pc == (p + 1)->low)
    ++p;
  fmatch = NULL;
  while (1)
    {
      if (pc < p->high)
	{
	  fmatch = p;
	  break;
	}
      if (p == entry->u->function_addrs)
	break;
      if ((p - 1)->low < p->low)
	break;
      --p;
    }
  if (fmatch == NULL)
    return callback (data, pc, 0, ln->filename, ln->lineno, NULL);

  function = fmatch->function;

  filename = ln->filename;
  lineno = ln->lineno;

  ret = report_inlined_functions (pc, function, callback, data,
				  &filename, &lineno);
  if (ret != 0)
    return ret;

  return callback (data, pc, fmatch->low, filename, lineno, function->name);
}